

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tiles.h
# Opt level: O2

vector<unsigned_char,_std::allocator<unsigned_char>_> *
sfc::mirror<unsigned_char>
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *source,uint width,bool horizontal,
          bool vertical)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  ulong uVar3;
  runtime_error *this;
  ulong uVar4;
  int iVar5;
  ulong uVar6;
  pointer puVar7;
  uint uVar8;
  ulong uVar9;
  bool bVar10;
  vector<unsigned_char,_std::allocator<unsigned_char>_> mv;
  
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(__return_storage_ptr__,source);
  uVar4 = (long)(source->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(source->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                super__Vector_impl_data._M_start;
  uVar6 = CONCAT44(0,width);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar6;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = uVar4;
  uVar3 = SUB168(auVar2 / auVar1,0);
  if ((uVar4 % uVar6 == 0) && (uVar4 == SUB164(auVar2 / auVar1,0) * width)) {
    if (horizontal) {
      uVar9 = 0;
      for (uVar4 = 0; uVar4 < (uVar3 & 0xffffffff); uVar4 = uVar4 + 1) {
        puVar7 = (__return_storage_ptr__->
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                 super__Vector_impl_data._M_start + uVar9;
        std::
        __reverse<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                  (puVar7,puVar7 + uVar6);
        uVar9 = (ulong)((int)uVar9 + width);
      }
    }
    if (vertical) {
      mv.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      mv.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      mv.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      while( true ) {
        uVar8 = (int)uVar3 - 1;
        uVar3 = (ulong)uVar8;
        if ((int)uVar8 < 0) break;
        iVar5 = 0;
        uVar4 = uVar6;
        while (bVar10 = uVar4 != 0, uVar4 = uVar4 - 1, bVar10) {
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                    (&mv,(__return_storage_ptr__->
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                         super__Vector_impl_data._M_start + (uVar8 * width + iVar5));
          iVar5 = iVar5 + 1;
        }
      }
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                (__return_storage_ptr__,&mv);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                (&mv.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    }
    return __return_storage_ptr__;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,"Can\'t mirror non-square image vector");
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

inline std::vector<T> mirror(const std::vector<T>& source, unsigned width, bool horizontal, bool vertical) {
  auto m = source;
  unsigned height = (unsigned)(source.size() / width);
  if ((source.size() % width != 0) || (source.size() != width * height))
    throw std::runtime_error("Can't mirror non-square image vector");

  if (horizontal) {
    for (unsigned row = 0; row < height; ++row)
      std::reverse(m.begin() + (row * width), m.begin() + (row * width) + width);
  }

  if (vertical) {
    std::vector<T> mv;
    for (int row = height - 1; row >= 0; --row) {
      for (unsigned column = 0; column < width; ++column)
        mv.push_back(m[(row * width) + column]);
    }
    m = mv;
  }

  return m;
}